

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

tuple<long,_long> calcSum<short>(TWaveformViewT<short> *waveform)

{
  _Head_base<0UL,_long,_false> extraout_RDX;
  long in_RSI;
  _Head_base<1UL,_long,_false> in_RDI;
  tuple<long,_long> tVar1;
  int32_t a0;
  int is;
  int64_t n;
  short *samples;
  int64_t sum2;
  int64_t sum;
  undefined4 local_34;
  
  for (local_34 = 0; (long)local_34 < *(long *)(in_RSI + 8); local_34 = local_34 + 1) {
  }
  std::tuple<long,_long>::tuple<long_&,_long_&,_true>
            ((tuple<long,_long> *)in_RDI._M_head_impl,(long *)in_RDI._M_head_impl,(long *)0x15b3f1);
  tVar1.super__Tuple_impl<0UL,_long,_long>.super__Head_base<0UL,_long,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar1.super__Tuple_impl<0UL,_long,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)in_RDI._M_head_impl;
  return (tuple<long,_long>)tVar1.super__Tuple_impl<0UL,_long,_long>;
}

Assistant:

std::tuple<int64_t, int64_t> calcSum(const TWaveformViewT<T> & waveform) {
    int64_t sum = 0;
    int64_t sum2 = 0;

    auto samples = waveform.samples;
    auto n       = waveform.n;

    for (int is = 0; is < n; ++is) {
        int32_t a0 = samples[is];
        sum += a0;
        sum2 += a0*a0;
    }

    return std::tuple<int64_t, int64_t>(sum, sum2);
}